

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall
VmaVirtualBlock_T::VmaVirtualBlock_T(VmaVirtualBlock_T *this,VmaVirtualBlockCreateInfo *createInfo)

{
  void *pvVar1;
  PFN_vkAllocationFunction p_Var2;
  PFN_vkReallocationFunction p_Var3;
  PFN_vkFreeFunction p_Var4;
  PFN_vkInternalFreeNotification p_Var5;
  uint uVar6;
  VmaBlockMetadata_TLSF *pVVar7;
  VmaBlockMetadata_Linear *pVVar8;
  VmaBlockMetadata_TLSF *in_RSI;
  VmaVirtualBlock_T *in_RDI;
  VmaBlockMetadata_Linear *unaff_retaddr;
  uint32_t algorithm;
  VkAllocationCallbacks *local_30;
  VkAllocationCallbacks *bufferImageGranularity;
  undefined4 in_stack_ffffffffffffffe8;
  undefined1 isVirtual;
  VmaVirtualBlock_T *pAllocationCallbacks;
  
  in_RDI->m_AllocationCallbacksSpecified =
       (in_RSI->super_VmaBlockMetadata).m_pAllocationCallbacks != (VkAllocationCallbacks *)0x0;
  bufferImageGranularity = &in_RDI->m_AllocationCallbacks;
  if ((in_RSI->super_VmaBlockMetadata).m_pAllocationCallbacks == (VkAllocationCallbacks *)0x0) {
    local_30 = &VmaEmptyAllocationCallbacks;
  }
  else {
    local_30 = (in_RSI->super_VmaBlockMetadata).m_pAllocationCallbacks;
  }
  pvVar1 = local_30->pUserData;
  p_Var2 = local_30->pfnAllocation;
  p_Var3 = local_30->pfnReallocation;
  p_Var4 = local_30->pfnFree;
  p_Var5 = local_30->pfnInternalFree;
  (in_RDI->m_AllocationCallbacks).pfnInternalAllocation = local_30->pfnInternalAllocation;
  (in_RDI->m_AllocationCallbacks).pfnInternalFree = p_Var5;
  (in_RDI->m_AllocationCallbacks).pfnReallocation = p_Var3;
  (in_RDI->m_AllocationCallbacks).pfnFree = p_Var4;
  bufferImageGranularity->pUserData = pvVar1;
  (in_RDI->m_AllocationCallbacks).pfnAllocation = p_Var2;
  uVar6 = (uint)(in_RSI->super_VmaBlockMetadata).m_Size & 1;
  if ((uVar6 == 0) || (uVar6 != 1)) {
    GetAllocationCallbacks(in_RDI);
    pVVar7 = VmaAllocate<VmaBlockMetadata_TLSF>((VkAllocationCallbacks *)0x2f34e9);
    VmaBlockMetadata_TLSF::VmaBlockMetadata_TLSF
              (in_RSI,(VkAllocationCallbacks *)CONCAT44(uVar6,in_stack_ffffffffffffffe8),
               (VkDeviceSize)bufferImageGranularity,SUB81((ulong)in_RDI >> 0x38,0));
    in_RDI->m_Metadata = &pVVar7->super_VmaBlockMetadata;
  }
  else {
    pAllocationCallbacks = in_RDI;
    GetAllocationCallbacks(in_RDI);
    isVirtual = (undefined1)(uVar6 >> 0x18);
    pVVar8 = VmaAllocate<VmaBlockMetadata_Linear>((VkAllocationCallbacks *)0x2f3526);
    VmaBlockMetadata_Linear::VmaBlockMetadata_Linear
              (unaff_retaddr,(VkAllocationCallbacks *)pAllocationCallbacks,(VkDeviceSize)in_RSI,
               (bool)isVirtual);
    in_RDI->m_Metadata = &pVVar8->super_VmaBlockMetadata;
  }
  (*in_RDI->m_Metadata->_vptr_VmaBlockMetadata[2])
            (in_RDI->m_Metadata,(in_RSI->super_VmaBlockMetadata)._vptr_VmaBlockMetadata);
  return;
}

Assistant:

VmaVirtualBlock_T::VmaVirtualBlock_T(const VmaVirtualBlockCreateInfo& createInfo)
    : m_AllocationCallbacksSpecified(createInfo.pAllocationCallbacks != VMA_NULL),
    m_AllocationCallbacks(createInfo.pAllocationCallbacks != VMA_NULL ? *createInfo.pAllocationCallbacks : VmaEmptyAllocationCallbacks)
{
    const uint32_t algorithm = createInfo.flags & VMA_VIRTUAL_BLOCK_CREATE_ALGORITHM_MASK;
    switch (algorithm)
    {
    default:
        VMA_ASSERT(0);
    case 0:
        m_Metadata = vma_new(GetAllocationCallbacks(), VmaBlockMetadata_TLSF)(VK_NULL_HANDLE, 1, true);
        break;
    case VMA_VIRTUAL_BLOCK_CREATE_LINEAR_ALGORITHM_BIT:
        m_Metadata = vma_new(GetAllocationCallbacks(), VmaBlockMetadata_Linear)(VK_NULL_HANDLE, 1, true);
        break;
    }

    m_Metadata->Init(createInfo.size);
}